

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

void CMU462::Collada::ColladaParser::parse_polymesh(XMLElement *xml,PolymeshInfo *polymesh)

{
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *this;
  float fVar1;
  float fVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  __type _Var6;
  _Ios_Openmode _Var7;
  int iVar8;
  char *pcVar9;
  XMLElement *pXVar10;
  mapped_type *pmVar11;
  double dVar12;
  reference pvVar13;
  size_type __new_size;
  pointer __new_size_00;
  XMLElement *this_00;
  reference pvVar14;
  reference pvVar15;
  ulong local_8a0;
  size_t j_2;
  size_t i_8;
  size_t k_2;
  size_t j_1;
  size_t i_7;
  size_t k_1;
  size_t j;
  size_t i_6;
  size_t k;
  size_t i_5;
  stringstream ss_2;
  allocator<char> local_6c1;
  string local_6c0 [8];
  string s_2;
  size_t index;
  XMLElement *e_p;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  size_t i_4;
  stringstream ss_1;
  allocator<char> local_4e1;
  string local_4e0 [8];
  string s_1;
  size_t size;
  XMLElement *e_vcount;
  size_t num_indices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes;
  size_t stride;
  size_t num_polygons;
  Vector2D n_1;
  size_t i_3;
  size_t num_floats_3;
  vector<float,_std::allocator<float>_> *floats_3;
  _Self local_450;
  undefined1 local_448 [8];
  Vector3D n;
  size_t i_2;
  size_t num_floats_2;
  vector<float,_std::allocator<float>_> *floats_2;
  _Self local_410;
  Vector3D *local_408;
  Vector3D *local_400;
  __normal_iterator<CMU462::Vector3D_*,_std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>_>
  local_3f8;
  __normal_iterator<CMU462::Vector3D_*,_std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>_>
  local_3f0;
  XMLElement *local_3e8;
  size_t offset;
  undefined1 local_3d8 [8];
  string source_1;
  undefined1 local_3b0 [8];
  string semantic_1;
  XMLElement *e_input_1;
  size_t texcoord_offset;
  XMLElement *pXStack_378;
  bool has_texcoord_array;
  size_t normal_offset;
  XMLElement *pXStack_368;
  bool has_normal_array;
  size_t vertex_offset;
  bool has_vertex_array;
  XMLElement *e_polylist;
  Vector3D v;
  size_t i_1;
  size_t num_floats_1;
  vector<float,_std::allocator<float>_> *floats_1;
  _Self local_318;
  allocator<char> local_309;
  undefined1 local_308 [8];
  string source;
  undefined1 local_2e0 [8];
  string semantic;
  XMLElement *e_input;
  XMLElement *e_vertices;
  string vertices_id;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> vertices;
  size_t i;
  size_t num_floats;
  stringstream ss;
  allocator<char> local_d9;
  string local_d8 [8];
  string s;
  vector<float,_std::allocator<float>_> floats;
  float f;
  XMLElement *e_float_array;
  undefined1 local_88 [8];
  string source_id;
  XMLElement *local_58;
  XMLElement *e_source;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
  arr_sources;
  XMLElement *e_mesh;
  PolymeshInfo *polymesh_local;
  XMLElement *xml_local;
  
  pcVar9 = tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  std::__cxx11::string::operator=((string *)&(polymesh->super_Instance).id,pcVar9);
  pcVar9 = tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  std::__cxx11::string::operator=((string *)&(polymesh->super_Instance).name,pcVar9);
  (polymesh->super_Instance).type = POLYMESH;
  arr_sources._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)tinyxml2::XMLNode::FirstChildElement(&xml->super_XMLNode,"mesh");
  if ((XMLElement *)arr_sources._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      (XMLElement *)0x0) {
    exit(1);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
         *)&e_source);
  local_58 = tinyxml2::XMLNode::FirstChildElement
                       ((XMLNode *)arr_sources._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        "source");
  while (local_58 != (XMLElement *)0x0) {
    pcVar9 = tinyxml2::XMLElement::Attribute(local_58,"id",(char *)0x0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,pcVar9,(allocator<char> *)((long)&e_float_array + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&e_float_array + 7));
    pXVar10 = tinyxml2::XMLNode::FirstChildElement(&local_58->super_XMLNode,"float_array");
    if (pXVar10 != (XMLElement *)0x0) {
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)((long)&s.field_2 + 8));
      pcVar9 = tinyxml2::XMLElement::GetText(pXVar10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_d8,pcVar9,&local_d9);
      std::allocator<char>::~allocator(&local_d9);
      _Var7 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream((stringstream *)&num_floats,local_d8,_Var7);
      iVar8 = tinyxml2::XMLElement::IntAttribute(pXVar10,"count");
      for (vertices.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vertices.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage < (pointer)(long)iVar8;
          vertices.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)&(vertices.
                                 super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->x + 1)) {
        std::istream::operator>>
                  ((istream *)&num_floats,
                   (float *)((long)&floats.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage + 4));
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)((long)&s.field_2 + 8),
                   (value_type_conflict2 *)
                   ((long)&floats.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 4));
      }
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                              *)&e_source,(key_type *)local_88);
      std::vector<float,_std::allocator<float>_>::operator=
                (pmVar11,(vector<float,_std::allocator<float>_> *)((long)&s.field_2 + 8));
      std::__cxx11::stringstream::~stringstream((stringstream *)&num_floats);
      std::__cxx11::string::~string(local_d8);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)((long)&s.field_2 + 8));
    }
    local_58 = tinyxml2::XMLNode::NextSiblingElement(&local_58->super_XMLNode,"source");
    std::__cxx11::string::~string((string *)local_88);
  }
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::vector
            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)
             ((long)&vertices_id.field_2 + 8));
  std::__cxx11::string::string((string *)&e_vertices);
  pXVar10 = tinyxml2::XMLNode::FirstChildElement
                      ((XMLNode *)arr_sources._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       "vertices");
  if (pXVar10 == (XMLElement *)0x0) {
    exit(1);
  }
  pcVar9 = tinyxml2::XMLElement::Attribute(pXVar10,"id",(char *)0x0);
  std::__cxx11::string::operator=((string *)&e_vertices,pcVar9);
  semantic.field_2._8_8_ = tinyxml2::XMLNode::FirstChildElement(&pXVar10->super_XMLNode,"input");
  while (semantic.field_2._8_8_ != 0) {
    pcVar9 = tinyxml2::XMLElement::Attribute
                       ((XMLElement *)semantic.field_2._8_8_,"semantic",(char *)0x0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2e0,pcVar9,(allocator<char> *)(source.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(source.field_2._M_local_buf + 0xf));
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2e0,"POSITION");
    if (bVar5) {
      pcVar9 = tinyxml2::XMLElement::Attribute
                         ((XMLElement *)semantic.field_2._8_8_,"source",(char *)0x0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_308,pcVar9 + 1,&local_309);
      std::allocator<char>::~allocator(&local_309);
      local_318._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                   *)&e_source,(key_type *)local_308);
      floats_1 = (vector<float,_std::allocator<float>_> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                        *)&e_source);
      bVar5 = std::operator!=(&local_318,(_Self *)&floats_1);
      if (!bVar5) {
        exit(1);
      }
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                              *)&e_source,(key_type *)local_308);
      dVar12 = (double)std::vector<float,_std::allocator<float>_>::size(pmVar11);
      for (v.z = 0.0; (ulong)v.z < (ulong)dVar12; v.z = (double)((long)v.z + 3)) {
        pvVar13 = std::vector<float,_std::allocator<float>_>::operator[](pmVar11,(size_type)v.z);
        fVar1 = *pvVar13;
        pvVar13 = std::vector<float,_std::allocator<float>_>::operator[](pmVar11,(long)v.z + 1);
        fVar2 = *pvVar13;
        pvVar13 = std::vector<float,_std::allocator<float>_>::operator[](pmVar11,(long)v.z + 2);
        Vector3D::Vector3D((Vector3D *)&e_polylist,(double)fVar1,(double)fVar2,(double)*pvVar13);
        std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
                  ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)
                   ((long)&vertices_id.field_2 + 8),(value_type *)&e_polylist);
      }
      std::__cxx11::string::~string((string *)local_308);
    }
    semantic.field_2._8_8_ =
         (size_type)tinyxml2::XMLNode::NextSiblingElement(semantic.field_2._8_8_,"input");
    std::__cxx11::string::~string((string *)local_2e0);
  }
  pXVar10 = tinyxml2::XMLNode::FirstChildElement
                      ((XMLNode *)arr_sources._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       "polylist");
  if (pXVar10 != (XMLElement *)0x0) {
    bVar3 = 0;
    pXStack_368 = (XMLElement *)0x0;
    bVar4 = 0;
    pXStack_378 = (XMLElement *)0x0;
    texcoord_offset._7_1_ = 0;
    e_input_1 = (XMLElement *)0x0;
    semantic_1.field_2._8_8_ = tinyxml2::XMLNode::FirstChildElement(&pXVar10->super_XMLNode,"input")
    ;
    while (semantic_1.field_2._8_8_ != 0) {
      pcVar9 = tinyxml2::XMLElement::Attribute
                         ((XMLElement *)semantic_1.field_2._8_8_,"semantic",(char *)0x0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3b0,pcVar9,(allocator<char> *)(source_1.field_2._M_local_buf + 0xf)
                );
      std::allocator<char>::~allocator((allocator<char> *)(source_1.field_2._M_local_buf + 0xf));
      pcVar9 = tinyxml2::XMLElement::Attribute
                         ((XMLElement *)semantic_1.field_2._8_8_,"source",(char *)0x0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3d8,pcVar9 + 1,(allocator<char> *)((long)&offset + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&offset + 7));
      iVar8 = tinyxml2::XMLElement::IntAttribute((XMLElement *)semantic_1.field_2._8_8_,"offset");
      local_3e8 = (XMLElement *)(long)iVar8;
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_3b0,"VERTEX");
      if (bVar5) {
        bVar3 = 1;
        pXStack_368 = local_3e8;
        _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_3d8,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&e_vertices);
        if (!_Var6) {
          exit(1);
        }
        __new_size = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::size
                               ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)
                                ((long)&vertices_id.field_2 + 8));
        std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize
                  (&polymesh->vertices,__new_size);
        this = (vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)
               ((long)&vertices_id.field_2 + 8);
        local_3f0._M_current =
             (Vector3D *)
             std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::begin(this);
        local_3f8._M_current =
             (Vector3D *)std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::end(this)
        ;
        local_400 = (Vector3D *)
                    std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::begin
                              (&polymesh->vertices);
        local_408 = (Vector3D *)
                    std::
                    copy<__gnu_cxx::__normal_iterator<CMU462::Vector3D*,std::vector<CMU462::Vector3D,std::allocator<CMU462::Vector3D>>>,__gnu_cxx::__normal_iterator<CMU462::Vector3D*,std::vector<CMU462::Vector3D,std::allocator<CMU462::Vector3D>>>>
                              (local_3f0,local_3f8,
                               (__normal_iterator<CMU462::Vector3D_*,_std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>_>
                                )local_400);
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_3b0,"NORMAL");
      if (bVar5) {
        bVar4 = 1;
        pXStack_378 = local_3e8;
        local_410._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                     *)&e_source,(key_type *)local_3d8);
        floats_2 = (vector<float,_std::allocator<float>_> *)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                          *)&e_source);
        bVar5 = std::operator!=(&local_410,(_Self *)&floats_2);
        if (!bVar5) {
          exit(1);
        }
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                                *)&e_source,(key_type *)local_3d8);
        dVar12 = (double)std::vector<float,_std::allocator<float>_>::size(pmVar11);
        for (n.z = 0.0; (ulong)n.z < (ulong)dVar12; n.z = (double)((long)n.z + 3)) {
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[](pmVar11,(size_type)n.z);
          fVar1 = *pvVar13;
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[](pmVar11,(long)n.z + 1);
          fVar2 = *pvVar13;
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[](pmVar11,(long)n.z + 2);
          Vector3D::Vector3D((Vector3D *)local_448,(double)fVar1,(double)fVar2,(double)*pvVar13);
          std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
                    (&polymesh->normals,(value_type *)local_448);
        }
      }
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_3b0,"TEXCOORD");
      if (bVar5) {
        texcoord_offset._7_1_ = 1;
        e_input_1 = local_3e8;
        local_450._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                     *)&e_source,(key_type *)local_3d8);
        floats_3 = (vector<float,_std::allocator<float>_> *)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                          *)&e_source);
        bVar5 = std::operator!=(&local_450,(_Self *)&floats_3);
        if (!bVar5) {
          exit(1);
        }
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                                *)&e_source,(key_type *)local_3d8);
        dVar12 = (double)std::vector<float,_std::allocator<float>_>::size(pmVar11);
        for (n_1.y = 0.0; (ulong)n_1.y < (ulong)dVar12; n_1.y = (double)((long)n_1.y + 2)) {
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[](pmVar11,(size_type)n_1.y)
          ;
          fVar1 = *pvVar13;
          pvVar13 = std::vector<float,_std::allocator<float>_>::operator[](pmVar11,(long)n_1.y + 1);
          Vector2D::Vector2D((Vector2D *)&num_polygons,(double)fVar1,(double)*pvVar13);
          std::vector<CMU462::Vector2D,_std::allocator<CMU462::Vector2D>_>::push_back
                    (&polymesh->texcoords,(value_type *)&num_polygons);
        }
      }
      semantic_1.field_2._8_8_ =
           (size_type)tinyxml2::XMLNode::NextSiblingElement(semantic_1.field_2._8_8_,"input");
      std::__cxx11::string::~string((string *)local_3d8);
      std::__cxx11::string::~string((string *)local_3b0);
    }
    iVar8 = tinyxml2::XMLElement::IntAttribute(pXVar10,"count");
    __new_size_00 = (pointer)(long)iVar8;
    sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(ulong)((uint)bVar3 + (uint)bVar4 + (uint)texcoord_offset._7_1_);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&num_indices);
    e_vcount = (XMLElement *)0x0;
    this_00 = tinyxml2::XMLNode::FirstChildElement(&pXVar10->super_XMLNode,"vcount");
    if (this_00 == (XMLElement *)0x0) {
      exit(1);
    }
    pcVar9 = tinyxml2::XMLElement::GetText(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_4e0,pcVar9,&local_4e1);
    std::allocator<char>::~allocator(&local_4e1);
    _Var7 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream((stringstream *)&i_4,local_4e0,_Var7);
    for (indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage < __new_size_00;
        indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)indices.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
      std::istream::operator>>((istream *)&i_4,(ulong *)(s_1.field_2._M_local_buf + 8));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&num_indices,
                 (value_type_conflict1 *)(s_1.field_2._M_local_buf + 8));
      e_vcount = (XMLElement *)
                 ((long)&(e_vcount->super_XMLNode)._vptr_XMLNode +
                 s_1.field_2._8_8_ *
                 (long)sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&i_4);
    std::__cxx11::string::~string(local_4e0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&e_p);
    pXVar10 = tinyxml2::XMLNode::FirstChildElement(&pXVar10->super_XMLNode,"p");
    if (pXVar10 == (XMLElement *)0x0) {
      exit(1);
    }
    pcVar9 = tinyxml2::XMLElement::GetText(pXVar10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_6c0,pcVar9,&local_6c1);
    std::allocator<char>::~allocator(&local_6c1);
    _Var7 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream((stringstream *)&i_5,local_6c0,_Var7);
    for (k = 0; k < e_vcount; k = k + 1) {
      std::istream::operator>>((istream *)&i_5,(ulong *)(s_2.field_2._M_local_buf + 8));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&e_p,
                 (value_type_conflict1 *)(s_2.field_2._M_local_buf + 8));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&i_5);
    std::__cxx11::string::~string(local_6c0);
    std::vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>::resize
              (&polymesh->polygons,(size_type)__new_size_00);
    if (bVar3 != 0) {
      i_6 = 0;
      for (j = 0; j < __new_size_00; j = j + 1) {
        for (k_1 = 0; pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                operator[]((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           &num_indices,j), k_1 < *pvVar14; k_1 = k_1 + 1) {
          pvVar15 = std::vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>
                    ::operator[](&polymesh->polygons,j);
          pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&e_p,
                               (size_type)
                               ((long)&(pXStack_368->super_XMLNode)._vptr_XMLNode +
                               i_6 * (long)sizes.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage));
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&pvVar15->vertex_indices,pvVar14);
          i_6 = i_6 + 1;
        }
      }
    }
    if (bVar4 != 0) {
      i_7 = 0;
      for (j_1 = 0; j_1 < __new_size_00; j_1 = j_1 + 1) {
        for (k_2 = 0; pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                operator[]((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           &num_indices,j_1), k_2 < *pvVar14; k_2 = k_2 + 1) {
          pvVar15 = std::vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>
                    ::operator[](&polymesh->polygons,j_1);
          pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&e_p,
                               (size_type)
                               ((long)&(pXStack_378->super_XMLNode)._vptr_XMLNode +
                               i_7 * (long)sizes.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage));
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&pvVar15->normal_indices,pvVar14);
          i_7 = i_7 + 1;
        }
      }
    }
    if (bVar4 != 0) {
      i_8 = 0;
      for (j_2 = 0; j_2 < __new_size_00; j_2 = j_2 + 1) {
        for (local_8a0 = 0;
            pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &num_indices,j_2), local_8a0 < *pvVar14; local_8a0 = local_8a0 + 1)
        {
          pvVar15 = std::vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>
                    ::operator[](&polymesh->polygons,j_2);
          pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&e_p,
                               (size_type)
                               ((long)&(e_input_1->super_XMLNode)._vptr_XMLNode +
                               i_8 * (long)sizes.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage));
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&pvVar15->texcoord_indices,pvVar14);
          i_8 = i_8 + 1;
        }
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&e_p);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&num_indices);
  }
  std::__cxx11::string::~string((string *)&e_vertices);
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::~vector
            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)
             ((long)&vertices_id.field_2 + 8));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
          *)&e_source);
  return;
}

Assistant:

void ColladaParser::parse_polymesh(XMLElement* xml, PolymeshInfo& polymesh) {

  // name & id
  polymesh.id   = xml->Attribute( "id" );
  polymesh.name = xml->Attribute("name");
  polymesh.type = Instance::POLYMESH;

  XMLElement* e_mesh = xml->FirstChildElement("mesh");
  if (!e_mesh) {
    stat("Error: no mesh data defined in geometry: " << polymesh.id);
    exit(EXIT_FAILURE);
  }

  // array sources
  map< string, vector<float> > arr_sources;
  XMLElement* e_source = e_mesh->FirstChildElement("source");
  while (e_source) {

    // source id
    string source_id = e_source->Attribute("id");

    // source float array - other formats not handled
    XMLElement* e_float_array = e_source->FirstChildElement("float_array");
    if (e_float_array) {

      float f; vector<float> floats;

      // load float array string
      string s = e_float_array->GetText();
      stringstream ss (s);

      // load float array
      size_t num_floats = e_float_array->IntAttribute("count");
      for (size_t i = 0; i < num_floats; ++i) {
        ss >> f; floats.push_back(f);
      }

      // add to array sources
      arr_sources[source_id] = floats;
    }

    // parse next source
    e_source = e_source->NextSiblingElement("source");
  }

  // vertices
  vector<Vector3D> vertices; string vertices_id;
  XMLElement* e_vertices = e_mesh->FirstChildElement("vertices");
  if (!e_vertices) {
    stat("Error: no vertices defined in geometry: " << polymesh.id);
    exit(EXIT_FAILURE);
  } else {
    vertices_id = e_vertices->Attribute("id");
  }

  XMLElement* e_input = e_vertices->FirstChildElement("input");
  while (e_input) {

    // input semantic
    string semantic = e_input->Attribute("semantic");

    // semantic - position
    if (semantic == "POSITION") {
      string source = e_input->Attribute("source") + 1;
      if (arr_sources.find(source) != arr_sources.end()) {
        vector<float>& floats = arr_sources[source];
        size_t num_floats = floats.size();
        for (size_t i = 0; i < num_floats; i += 3) {
          Vector3D v = Vector3D(floats[i], floats[i+1], floats[i+2]);
          vertices.push_back(v);
        }
      } else {
        stat("Error: undefined input source: " << source);
        exit(EXIT_FAILURE);
      }
    }

    // NOTE (sky) : only positions are handled currently

    e_input = e_input->NextSiblingElement("input");
  }

  // polylist
  XMLElement* e_polylist = e_mesh->FirstChildElement("polylist");
  if (e_polylist) {

    // input arrays & array offsets
    bool has_vertex_array   = false; size_t vertex_offset   = 0;
    bool has_normal_array   = false; size_t normal_offset   = 0;
    bool has_texcoord_array = false; size_t texcoord_offset = 0;

    // input arr_sources
    XMLElement* e_input = e_polylist->FirstChildElement("input");
    while (e_input) {

      string semantic = e_input->Attribute("semantic");
      string source   = e_input->Attribute("source") + 1;
      size_t offset   = e_input->IntAttribute("offset");

      // vertex array source
      if (semantic == "VERTEX") {

        has_vertex_array = true;
        vertex_offset = offset;

        if (source == vertices_id) {
          polymesh.vertices.resize(vertices.size());
          copy(vertices.begin(), vertices.end(), polymesh.vertices.begin());
        } else {
          stat("Error: undefined source for VERTEX semantic: " << source);
          exit(EXIT_FAILURE);
        }
      }

      // normal array source
      if (semantic == "NORMAL") {

        has_normal_array = true;
        normal_offset = offset;

        if (arr_sources.find(source) != arr_sources.end()) {
          vector<float>& floats = arr_sources[source];
          size_t num_floats = floats.size();
          for (size_t i = 0; i < num_floats; i += 3) {
            Vector3D n = Vector3D(floats[i], floats[i+1], floats[i+2]);
            polymesh.normals.push_back(n);
          }
        } else {
          stat("Error: undefined source for NORMAL semantic: " << source);
          exit(EXIT_FAILURE);
        }
      }

      // texcoord array source
      if (semantic == "TEXCOORD") {

        has_texcoord_array = true;
        texcoord_offset = offset;

        if (arr_sources.find(source) != arr_sources.end()) {
          vector<float>& floats = arr_sources[source];
          size_t num_floats = floats.size();
          for (size_t i = 0; i < num_floats; i += 2) {
            Vector2D n = Vector2D(floats[i], floats[i+1]);
            polymesh.texcoords.push_back(n);
          }
        } else {
          stat("Error: undefined source for TEXCOORD semantic: " << source);
          exit(EXIT_FAILURE);
        }
      }

      e_input = e_input->NextSiblingElement("input");
    }

    // polygon info
    size_t num_polygons = e_polylist->IntAttribute("count");
    size_t stride = ( has_vertex_array   ? 1 : 0 ) +
                    ( has_normal_array   ? 1 : 0 ) +
                    ( has_texcoord_array ? 1 : 0 ) ;

    // create polygon size array and compute size of index array
    vector<size_t> sizes; size_t num_indices = 0;
    XMLElement* e_vcount = e_polylist->FirstChildElement("vcount");
    if (e_vcount) {

      size_t size;
      string s = e_vcount->GetText();
      stringstream ss (s);

      for (size_t i = 0; i < num_polygons; ++i) {
        ss >> size;
        sizes.push_back(size);
        num_indices += size * stride;
      }

    } else {
      stat("Error: polygon sizes undefined in geometry: " << polymesh.id);
      exit(EXIT_FAILURE);
    }

    // index array
    vector<size_t> indices;
    XMLElement* e_p = e_polylist->FirstChildElement("p");
    if (e_p) {

      size_t index;
      string s = e_p->GetText();
      stringstream ss (s);

      for (size_t i = 0; i < num_indices; ++i) {
        ss >> index;
        indices.push_back(index);
      }

    } else {
      stat("Error: no index array defined in geometry: " << polymesh.id);
      exit(EXIT_FAILURE);
    }

    // create polygons
    polymesh.polygons.resize(num_polygons);

    // vertex array indices
    if (has_vertex_array) {
      size_t k = 0;
      for (size_t i = 0; i < num_polygons; ++i) {
        for (size_t j = 0; j < sizes[i]; ++j) {
          polymesh.polygons[i].vertex_indices.push_back(
            indices[k * stride + vertex_offset]
          );
          k++;
        }
      }
    }

    // normal array indices
    if (has_normal_array) {
      size_t k = 0;
      for (size_t i = 0; i < num_polygons; ++i) {
        for (size_t j = 0; j < sizes[i]; ++j) {
          polymesh.polygons[i].normal_indices.push_back(
            indices[k * stride + normal_offset]
          );
          k++;
        }
      }
    }

    // texcoord array indices
    if (has_normal_array) {
      size_t k = 0;
      for (size_t i = 0; i < num_polygons; ++i) {
        for (size_t j = 0; j < sizes[i]; ++j) {
          polymesh.polygons[i].texcoord_indices.push_back(
            indices[k * stride + texcoord_offset]
          );
          k++;
        }
      }
    }

  }

  // print summary
  stat("  |- " << polymesh);
}